

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d2tf.c
# Opt level: O1

void iauD2tf(int ndp,double days,char *sign,int *ihmsf)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar29;
  double dVar26;
  uint uVar30;
  uint uVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar32 [16];
  uint uVar36;
  uint uVar37;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 local_48;
  undefined1 auVar17 [16];
  
  *sign = (days < 0.0) * '\x02' + '+';
  dVar13 = ABS(days) * 86400.0;
  if (ndp < 0) {
    iVar1 = 1;
    if (1 < -ndp) {
      iVar1 = -ndp;
    }
    uVar2 = iVar1 - 1;
    iVar18 = 1;
    iVar20 = 2;
    iVar22 = 3;
    iVar24 = 4;
    iVar5 = 4;
    uVar8 = 1;
    uVar6 = 1;
    uVar36 = 1;
    uVar37 = 1;
    do {
      uVar31 = uVar37;
      uVar30 = uVar36;
      uVar29 = uVar6;
      uVar25 = uVar8;
      auVar34._0_4_ = -(uint)(iVar18 == 2);
      auVar34._4_4_ = -(uint)(iVar20 == 2);
      auVar34._8_4_ = -(uint)(iVar22 == 2);
      auVar34._12_4_ = -(uint)(iVar24 == 2);
      auVar33._0_4_ = -(uint)(iVar18 == 4);
      auVar33._4_4_ = -(uint)(iVar20 == 4);
      auVar33._8_4_ = -(uint)(iVar22 == 4);
      auVar33._12_4_ = -(uint)(iVar24 == 4);
      auVar34 = (auVar33 | auVar34) & _DAT_00128210 | ~(auVar33 | auVar34) & _DAT_00128200;
      uVar8 = auVar34._0_4_ * uVar25;
      uVar36 = (uint)((auVar34._8_8_ & 0xffffffff) * (ulong)uVar30);
      auVar35._4_4_ = uVar29;
      auVar35._0_4_ = uVar29;
      auVar35._8_4_ = uVar31;
      auVar35._12_4_ = uVar31;
      uVar6 = uVar29 * auVar34._4_4_;
      uVar37 = (uint)((auVar35._8_8_ & 0xffffffff) * (ulong)auVar34._12_4_);
      iVar18 = iVar18 + 4;
      iVar20 = iVar20 + 4;
      iVar22 = iVar22 + 4;
      iVar24 = iVar24 + 4;
      iVar3 = iVar5 + -4;
      iVar7 = iVar5 + (iVar1 + 3U & 0xfffffffc);
      iVar5 = iVar3;
    } while (iVar7 != 8);
    uVar4 = -iVar3;
    uVar19 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)(uVar4 ^ 0x80000000));
    uVar21 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 1) ^ 0x80000000));
    uVar23 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 2) ^ 0x80000000));
    uVar2 = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 3) ^ 0x80000000));
    dVar26 = (double)(int)((~uVar23 & uVar36 | uVar30 & uVar23) *
                           (~uVar19 & uVar8 | uVar25 & uVar19) *
                          (~uVar21 & uVar6 | uVar29 & uVar21) * (~uVar2 & uVar37 | uVar31 & uVar2));
    dVar13 = dVar13 / dVar26;
    dVar14 = 0.0;
    if (0.5 <= ABS(dVar13)) {
      if (0.0 <= dVar13) {
        dVar13 = floor(dVar13 + 0.5);
        uVar9 = SUB84(dVar13,0);
        uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
      }
      else {
        dVar13 = ceil(dVar13 + -0.5);
        uVar9 = SUB84(dVar13,0);
        uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
      }
      dVar14 = (double)CONCAT44(uVar11,uVar9);
    }
    dVar13 = dVar14 * dVar26;
  }
  if (ndp < 1) {
    dVar14 = 1.0;
  }
  else {
    uVar8 = ndp - 1;
    auVar16 = _DAT_001281d0;
    iVar1 = 4;
    do {
      auVar34 = auVar16;
      auVar16._0_4_ = auVar34._0_4_ * 10;
      auVar17._8_4_ = (undefined4)((auVar34._8_8_ & 0xffffffff) * 10);
      auVar17._4_4_ = auVar17._8_4_;
      auVar17._0_4_ = auVar16._0_4_;
      iVar5 = auVar34._4_4_;
      auVar32._4_4_ = iVar5;
      auVar32._0_4_ = iVar5;
      auVar32._8_4_ = auVar34._12_4_;
      auVar32._12_4_ = auVar34._12_4_;
      auVar17._12_4_ = (int)((auVar32._8_8_ & 0xffffffff) * 10);
      auVar16._8_8_ = auVar17._8_8_;
      auVar16._4_4_ = iVar5 * 10;
      iVar5 = iVar1 + -4;
      iVar18 = iVar1 + (ndp + 3U & 0xfffffffc);
      iVar1 = iVar5;
    } while (iVar18 != 8);
    uVar6 = -iVar5;
    auVar27._0_8_ =
         CONCAT44(-(uint)((int)(uVar8 ^ 0x80000000) < (int)((uVar6 | 1) ^ 0x80000000)),
                  -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar6 ^ 0x80000000)));
    auVar27._8_4_ = -(uint)((int)(uVar8 ^ 0x80000000) < (int)((uVar6 | 2) ^ 0x80000000));
    auVar27._12_4_ = -(uint)((int)(uVar8 ^ 0x80000000) < (int)((uVar6 | 3) ^ 0x80000000));
    auVar28._0_8_ = auVar34._0_8_ & auVar27._0_8_;
    auVar28._8_8_ = auVar34._8_8_ & auVar27._8_8_;
    auVar28 = ~auVar27 & auVar16 | auVar28;
    dVar14 = (double)(auVar28._8_4_ * auVar28._0_4_ * auVar28._4_4_ * auVar28._12_4_);
  }
  dVar15 = dVar14 * 60.0;
  dVar13 = dVar13 * dVar14;
  dVar26 = 0.0;
  if (0.5 <= ABS(dVar13)) {
    if (0.0 <= dVar13) {
      dVar13 = floor(dVar13 + 0.5);
      uVar9 = SUB84(dVar13,0);
      uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
    }
    else {
      dVar13 = ceil(dVar13 + -0.5);
      uVar9 = SUB84(dVar13,0);
      uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
    }
    dVar26 = (double)CONCAT44(uVar11,uVar9);
  }
  dVar13 = dVar26 / (dVar15 * 60.0);
  if (0.0 <= dVar13) {
    dVar13 = floor(dVar13);
    uVar9 = SUB84(dVar13,0);
    uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  else {
    dVar13 = ceil(dVar13);
    uVar9 = SUB84(dVar13,0);
    uVar11 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  dVar26 = dVar26 - dVar15 * 60.0 * (double)CONCAT44(uVar11,uVar9);
  dVar13 = dVar26 / dVar15;
  if (0.0 <= dVar13) {
    dVar13 = floor(dVar13);
    uVar10 = SUB84(dVar13,0);
    uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  else {
    dVar13 = ceil(dVar13);
    uVar10 = SUB84(dVar13,0);
    uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  local_48 = (double)CONCAT44(uVar12,uVar10);
  dVar26 = dVar26 - dVar15 * (double)CONCAT44(uVar12,uVar10);
  dVar13 = dVar26 / dVar14;
  if (0.0 <= dVar13) {
    dVar13 = floor(dVar13);
    uVar10 = SUB84(dVar13,0);
    uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  else {
    dVar13 = ceil(dVar13);
    uVar10 = SUB84(dVar13,0);
    uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
  }
  *(ulong *)ihmsf = CONCAT44((int)local_48,(int)(double)CONCAT44(uVar11,uVar9));
  *(ulong *)(ihmsf + 2) =
       CONCAT44((int)(dVar26 - dVar14 * (double)CONCAT44(uVar12,uVar10)),
                (int)(double)CONCAT44(uVar12,uVar10));
  return;
}

Assistant:

void iauD2tf(int ndp, double days, char *sign, int ihmsf[4])
/*
**  - - - - - - - -
**   i a u D 2 t f
**  - - - - - - - -
**
**  Decompose days to hours, minutes, seconds, fraction.
**
**  This function is part of the International Astronomical Union's
**  SOFA (Standards Of Fundamental Astronomy) software collection.
**
**  Status:  vector/matrix support function.
**
**  Given:
**     ndp     int     resolution (Note 1)
**     days    double  interval in days
**
**  Returned:
**     sign    char*   '+' or '-'
**     ihmsf   int[4]  hours, minutes, seconds, fraction
**
**  Notes:
**
**  1) The argument ndp is interpreted as follows:
**
**     ndp         resolution
**      :      ...0000 00 00
**     -7         1000 00 00
**     -6          100 00 00
**     -5           10 00 00
**     -4            1 00 00
**     -3            0 10 00
**     -2            0 01 00
**     -1            0 00 10
**      0            0 00 01
**      1            0 00 00.1
**      2            0 00 00.01
**      3            0 00 00.001
**      :            0 00 00.000...
**
**  2) The largest positive useful value for ndp is determined by the
**     size of days, the format of double on the target platform, and
**     the risk of overflowing ihmsf[3].  On a typical platform, for
**     days up to 1.0, the available floating-point precision might
**     correspond to ndp=12.  However, the practical limit is typically
**     ndp=9, set by the capacity of a 32-bit int, or ndp=4 if int is
**     only 16 bits.
**
**  3) The absolute value of days may exceed 1.0.  In cases where it
**     does not, it is up to the caller to test for and handle the
**     case where days is very nearly 1.0 and rounds up to 24 hours,
**     by testing for ihmsf[0]=24 and setting ihmsf[0-3] to zero.
**
**  This revision:  2021 May 11
**
**  SOFA release 2021-05-12
**
**  Copyright (C) 2021 IAU SOFA Board.  See notes at end.
*/
{
   int nrs, n;
   double rs, rm, rh, a, w, ah, am, as, af;


/* Handle sign. */
   *sign = (char) ( ( days >= 0.0 ) ? '+' : '-' );

/* Interval in seconds. */
   a = DAYSEC * fabs(days);

/* Pre-round if resolution coarser than 1s (then pretend ndp=1). */
   if (ndp < 0) {
      nrs = 1;
      for (n = 1; n <= -ndp; n++) {
          nrs *= (n == 2 || n == 4) ? 6 : 10;
      }
      rs = (double) nrs;
      w = a / rs;
      a = rs * dnint(w);
   }

/* Express the unit of each field in resolution units. */
   nrs = 1;
   for (n = 1; n <= ndp; n++) {
      nrs *= 10;
   }
   rs = (double) nrs;
   rm = rs * 60.0;
   rh = rm * 60.0;

/* Round the interval and express in resolution units. */
   a = dnint(rs * a);

/* Break into fields. */
   ah = a / rh;
   ah = dint(ah);
   a -= ah * rh;
   am = a / rm;
   am = dint(am);
   a -= am * rm;
   as = a / rs;
   as = dint(as);
   af = a - as * rs;

/* Return results. */
   ihmsf[0] = (int) ah;
   ihmsf[1] = (int) am;
   ihmsf[2] = (int) as;
   ihmsf[3] = (int) af;

/* Finished. */

/*----------------------------------------------------------------------
**
**  Copyright (C) 2021
**  Standards Of Fundamental Astronomy Board
**  of the International Astronomical Union.
**
**  =====================
**  SOFA Software License
**  =====================
**
**  NOTICE TO USER:
**
**  BY USING THIS SOFTWARE YOU ACCEPT THE FOLLOWING SIX TERMS AND
**  CONDITIONS WHICH APPLY TO ITS USE.
**
**  1. The Software is owned by the IAU SOFA Board ("SOFA").
**
**  2. Permission is granted to anyone to use the SOFA software for any
**     purpose, including commercial applications, free of charge and
**     without payment of royalties, subject to the conditions and
**     restrictions listed below.
**
**  3. You (the user) may copy and distribute SOFA source code to others,
**     and use and adapt its code and algorithms in your own software,
**     on a world-wide, royalty-free basis.  That portion of your
**     distribution that does not consist of intact and unchanged copies
**     of SOFA source code files is a "derived work" that must comply
**     with the following requirements:
**
**     a) Your work shall be marked or carry a statement that it
**        (i) uses routines and computations derived by you from
**        software provided by SOFA under license to you; and
**        (ii) does not itself constitute software provided by and/or
**        endorsed by SOFA.
**
**     b) The source code of your derived work must contain descriptions
**        of how the derived work is based upon, contains and/or differs
**        from the original SOFA software.
**
**     c) The names of all routines in your derived work shall not
**        include the prefix "iau" or "sofa" or trivial modifications
**        thereof such as changes of case.
**
**     d) The origin of the SOFA components of your derived work must
**        not be misrepresented;  you must not claim that you wrote the
**        original software, nor file a patent application for SOFA
**        software or algorithms embedded in the SOFA software.
**
**     e) These requirements must be reproduced intact in any source
**        distribution and shall apply to anyone to whom you have
**        granted a further right to modify the source code of your
**        derived work.
**
**     Note that, as originally distributed, the SOFA software is
**     intended to be a definitive implementation of the IAU standards,
**     and consequently third-party modifications are discouraged.  All
**     variations, no matter how minor, must be explicitly marked as
**     such, as explained above.
**
**  4. You shall not cause the SOFA software to be brought into
**     disrepute, either by misuse, or use for inappropriate tasks, or
**     by inappropriate modification.
**
**  5. The SOFA software is provided "as is" and SOFA makes no warranty
**     as to its use or performance.   SOFA does not and cannot warrant
**     the performance or results which the user may obtain by using the
**     SOFA software.  SOFA makes no warranties, express or implied, as
**     to non-infringement of third party rights, merchantability, or
**     fitness for any particular purpose.  In no event will SOFA be
**     liable to the user for any consequential, incidental, or special
**     damages, including any lost profits or lost savings, even if a
**     SOFA representative has been advised of such damages, or for any
**     claim by any third party.
**
**  6. The provision of any version of the SOFA software under the terms
**     and conditions specified herein does not imply that future
**     versions will also be made available under the same terms and
**     conditions.
*
**  In any published work or commercial product which uses the SOFA
**  software directly, acknowledgement (see www.iausofa.org) is
**  appreciated.
**
**  Correspondence concerning SOFA software should be addressed as
**  follows:
**
**      By email:  sofa@ukho.gov.uk
**      By post:   IAU SOFA Center
**                 HM Nautical Almanac Office
**                 UK Hydrographic Office
**                 Admiralty Way, Taunton
**                 Somerset, TA1 2DN
**                 United Kingdom
**
**--------------------------------------------------------------------*/
}